

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOutJSON::out(ChArchiveOutJSON *this,ChNameValue<chrono::ChEnumMapperBase> *bVal)

{
  reference pvVar1;
  ChStreamOutAscii *pCVar2;
  char *pcVar3;
  ChEnumMapperBase *pCVar4;
  reference pvVar5;
  string local_38 [8];
  string mstr;
  ChNameValue<chrono::ChEnumMapperBase> *bVal_local;
  ChArchiveOutJSON *this_local;
  
  mstr.field_2._8_8_ = bVal;
  comma_cr(this);
  indent(this);
  pvVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->is_array);
  if ((*pvVar1 & 1U) == 0) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pcVar3 = ChNameValue<chrono::ChEnumMapperBase>::name(bVal);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,pcVar3);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t: ");
  }
  pCVar4 = ChNameValue<chrono::ChEnumMapperBase>::value(bVal);
  (*pCVar4->_vptr_ChEnumMapperBase[2])(local_38);
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,local_38);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
  pvVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
  *pvVar5 = *pvVar5 + 1;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void out     (ChNameValue<ChEnumMapperBase> bVal) {
            comma_cr();
            indent();
            if (is_array.top()==false)
                (*ostream) << "\"" << bVal.name() << "\"" << "\t: ";
            std::string mstr = bVal.value().GetValueAsString();
            (*ostream) << "\"" << mstr << "\"";
            ++nitems.top();
      }